

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarMatch(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nDist,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vPairs;
  Aig_Man_t *pManRes;
  Aig_Man_t *pMan2;
  Aig_Man_t *pMan1;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int nDist_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pManRes = (Aig_Man_t *)0x0;
  pNtkAig._0_4_ = fVerbose;
  pNtkAig._4_4_ = nDist;
  _fVerbose_local = pNtk2;
  pNtk2_local = pNtk1;
  iVar1 = Abc_NtkIsStrash(pNtk1);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0xc9a,"Abc_Ntk_t *Abc_NtkDarMatch(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  pMan2 = Abc_NtkToDar(pNtk2_local,0,1);
  if (pMan2 == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting miter into AIG has failed.\n");
    pNtk1_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Aig_ManRegNum(pMan2);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(pMan1) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                    ,0xca2,"Abc_Ntk_t *Abc_NtkDarMatch(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    if (_fVerbose_local != (Abc_Ntk_t *)0x0) {
      pManRes = Abc_NtkToDar(_fVerbose_local,0,1);
      if (pManRes == (Aig_Man_t *)0x0) {
        Abc_Print(1,"Converting miter into AIG has failed.\n");
        return (Abc_Ntk_t *)0x0;
      }
      iVar1 = Aig_ManRegNum(pManRes);
      if (iVar1 < 1) {
        __assert_fail("Aig_ManRegNum(pMan2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                      ,0xcac,"Abc_Ntk_t *Abc_NtkDarMatch(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
      }
    }
    p = Saig_StrSimPerformMatching(pMan2,pManRes,pNtkAig._4_4_,1,(Aig_Man_t **)&vPairs);
    pMan1 = (Aig_Man_t *)Abc_NtkFromAigPhase((Aig_Man_t *)vPairs);
    if (p != (Vec_Int_t *)0x0) {
      Vec_IntFree(p);
    }
    if (vPairs != (Vec_Int_t *)0x0) {
      Aig_ManStop((Aig_Man_t *)vPairs);
    }
    Aig_ManStop(pMan2);
    if (pManRes != (Aig_Man_t *)0x0) {
      Aig_ManStop(pManRes);
    }
    pNtk1_local = (Abc_Ntk_t *)pMan1;
  }
  return pNtk1_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarMatch( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nDist, int fVerbose )
{
    extern Vec_Int_t * Saig_StrSimPerformMatching( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose, Aig_Man_t ** ppMiter );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan2 = NULL, * pManRes;
    Vec_Int_t * vPairs;
    assert( Abc_NtkIsStrash(pNtk1) );
    // derive AIG manager
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return NULL;
    }
    assert( Aig_ManRegNum(pMan1) > 0 );
    // derive AIG manager
    if ( pNtk2 )
    {
        pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
        if ( pMan2 == NULL )
        {
            Abc_Print( 1, "Converting miter into AIG has failed.\n" );
            return NULL;
        }
        assert( Aig_ManRegNum(pMan2) > 0 );
    }

    // perform verification
    vPairs = Saig_StrSimPerformMatching( pMan1, pMan2, nDist, 1, &pManRes );
    pNtkAig = Abc_NtkFromAigPhase( pManRes );
    if ( vPairs )
        Vec_IntFree( vPairs );
    if ( pManRes )
        Aig_ManStop( pManRes );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    return pNtkAig;
}